

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

FileFlags __thiscall QFSFileEngine::fileFlags(QFSFileEngine *this,FileFlags type)

{
  QFlag QVar1;
  QFlag QVar2;
  bool bVar3;
  bool bVar4;
  Int value;
  QFlags<QFileSystemMetaData::MetaDataFlag> QVar5;
  Int value_00;
  QFSFileEnginePrivate *pQVar6;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool exists;
  QFSFileEnginePrivate *d;
  MetaDataFlags queryFlags;
  FileFlags ret;
  undefined4 in_stack_ffffffffffffff68;
  FileFlag in_stack_ffffffffffffff6c;
  enum_type in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar7;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_64;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_60;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_5c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_58;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> in_stack_ffffffffffffffac;
  QFlag local_50;
  QFlagsStorage<QAbstractFileEngine::FileFlag> local_4c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_48;
  Int local_44;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_40;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_3c;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_38;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_34;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_30;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_2c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_28;
  QFlag local_24 [2];
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> local_1c;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_18;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_14;
  QFlags<QAbstractFileEngine::FileFlag> local_10;
  QFlagsStorage<QAbstractFileEngine::FileFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QFSFileEngine *)0x171a52);
  local_14.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,
                                             CONCAT14(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70)))),
                  in_stack_ffffffffffffff6c);
  bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
  if (bVar3) {
    QFileSystemMetaData::clear
              ((QFileSystemMetaData *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,
                                 CONCAT15(in_stack_ffffffffffffff75,
                                          CONCAT14(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70)))));
  }
  local_c.i = 0xaaaaaaaa;
  memset(&local_c,0,4);
  QFlags<QAbstractFileEngine::FileFlag>::QFlags((QFlags<QAbstractFileEngine::FileFlag> *)0x171abf);
  local_18.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,
                                             CONCAT14(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70)))),
                  in_stack_ffffffffffffff6c);
  bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
  if (bVar3) {
    QFlags<QAbstractFileEngine::FileFlag>::operator|=
              ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,LocalDiskFlag);
  }
  local_1c.i = 0xaaaaaaaa;
  memset(&local_1c,0,4);
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)0x171b27);
  value = QFlags<QAbstractFileEngine::FileFlag>::toInt(&local_10);
  QFlag::QFlag(local_24,value);
  QVar1.i._1_1_ = in_stack_ffffffffffffff75;
  QVar1.i._0_1_ = in_stack_ffffffffffffff74;
  QVar1.i._2_1_ = in_stack_ffffffffffffff76;
  QVar1.i._3_1_ = in_stack_ffffffffffffff77;
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlagsStorageHelper
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),QVar1);
  QVar5 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                    ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,
                                       CONCAT15(in_stack_ffffffffffffff75,
                                                CONCAT14(in_stack_ffffffffffffff74,
                                                         in_stack_ffffffffffffff70)))),
                     in_stack_ffffffffffffff6c);
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_1c,QVar5);
  local_28.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,
                                             CONCAT14(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70)))),
                  in_stack_ffffffffffffff6c);
  bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_28);
  if (bVar3) {
    local_38.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         operator|(CONCAT13(in_stack_ffffffffffffff77,
                            CONCAT12(in_stack_ffffffffffffff76,
                                     CONCAT11(in_stack_ffffffffffffff75,in_stack_ffffffffffffff74)))
                   ,in_stack_ffffffffffffff70);
    local_34.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                   ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,
                                               CONCAT14(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    local_30.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                   ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,
                                               CONCAT14(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    local_2c.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                   ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,
                                               CONCAT14(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    QVar5 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                      ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                       CONCAT17(in_stack_ffffffffffffff77,
                                CONCAT16(in_stack_ffffffffffffff76,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6c);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_1c,QVar5);
  }
  local_3c.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
       (QFlagsStorage<QAbstractFileEngine::FileFlag>)
       QFlags<QAbstractFileEngine::FileFlag>::operator&
                 ((QFlags<QAbstractFileEngine::FileFlag> *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT15(in_stack_ffffffffffffff75,
                                             CONCAT14(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70)))),
                  in_stack_ffffffffffffff6c);
  bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_3c);
  if (bVar3) {
    QVar5 = operator|(CONCAT13(in_stack_ffffffffffffff77,
                               CONCAT12(in_stack_ffffffffffffff76,
                                        CONCAT11(in_stack_ffffffffffffff75,in_stack_ffffffffffffff74
                                                ))),in_stack_ffffffffffffff70);
    QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
              ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_1c,QVar5);
  }
  else {
    local_40.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,
                                               CONCAT14(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_40);
    if (bVar3) {
      QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
                ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_1c,WasDeletedAttribute);
    }
  }
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)&local_1c,LegacyLinkType);
  local_44 = local_1c.i;
  bVar3 = QFSFileEnginePrivate::doStat(in_RDI,(MetaDataFlags)in_stack_ffffffffffffffac.i);
  if ((bVar3) || (bVar4 = QFileSystemMetaData::isLink((QFileSystemMetaData *)0x171cbc), bVar4)) {
    uVar7 = false;
    if (bVar3) {
      local_48.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
           (QFlagsStorage<QAbstractFileEngine::FileFlag>)
           QFlags<QAbstractFileEngine::FileFlag>::operator&
                     ((QFlags<QAbstractFileEngine::FileFlag> *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff76,
                                      CONCAT15(in_stack_ffffffffffffff75,
                                               CONCAT14(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70))),
                      in_stack_ffffffffffffff6c);
      uVar7 = ::QFlags::operator_cast_to_bool((QFlags *)&local_48);
    }
    if ((bool)uVar7 != false) {
      QFileSystemMetaData::permissions
                ((QFileSystemMetaData *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      value_00 = QFlags<QFileDevice::Permission>::toInt
                           ((QFlags<QFileDevice::Permission> *)&stack0xffffffffffffffac);
      QFlag::QFlag(&local_50,value_00);
      QVar2.i._1_1_ = in_stack_ffffffffffffff75;
      QVar2.i._0_1_ = in_stack_ffffffffffffff74;
      QVar2.i._2_1_ = in_stack_ffffffffffffff76;
      QVar2.i._3_1_ = uVar7;
      QFlags<QAbstractFileEngine::FileFlag>::QFlagsStorageHelper
                ((QFlags<QAbstractFileEngine::FileFlag> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),QVar2);
      QFlags<QAbstractFileEngine::FileFlag>::operator|=
                ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,
                 (QFlags<QAbstractFileEngine::FileFlag>)local_4c.i);
    }
    local_58.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                            CONCAT15(in_stack_ffffffffffffff75,
                                                     CONCAT14(in_stack_ffffffffffffff74,
                                                              in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_58);
    if (bVar4) {
      bVar4 = QFileSystemMetaData::isAlias(&pQVar6->metaData);
      if (bVar4) {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,LinkType);
      }
      else {
        local_5c.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
             (QFlagsStorage<QAbstractFileEngine::FileFlag>)
             QFlags<QAbstractFileEngine::FileFlag>::operator&
                       ((QFlags<QAbstractFileEngine::FileFlag> *)
                        CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                        in_stack_ffffffffffffff6c);
        bVar4 = ::QFlags::operator_cast_to_bool((QFlags *)&local_5c);
        in_stack_ffffffffffffff76 = false;
        if (bVar4) {
          in_stack_ffffffffffffff76 = QFileSystemMetaData::isLink((QFileSystemMetaData *)0x171dd8);
        }
        if ((bool)in_stack_ffffffffffffff76 != false) {
          QFlags<QAbstractFileEngine::FileFlag>::operator|=
                    ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,LinkType);
        }
        if (bVar3) {
          bVar3 = QFileSystemMetaData::isFile((QFileSystemMetaData *)0x171e11);
          if (bVar3) {
            QFlags<QAbstractFileEngine::FileFlag>::operator|=
                      ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,FileType);
          }
          else {
            bVar3 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x171e3c);
            if (bVar3) {
              QFlags<QAbstractFileEngine::FileFlag>::operator|=
                        ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,DirectoryType);
              local_60.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
                   (QFlagsStorage<QAbstractFileEngine::FileFlag>)
                   QFlags<QAbstractFileEngine::FileFlag>::operator&
                             ((QFlags<QAbstractFileEngine::FileFlag> *)
                              CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                                      CONCAT15(in_stack_ffffffffffffff75,
                                                               CONCAT14(in_stack_ffffffffffffff74,
                                                                        in_stack_ffffffffffffff70)))
                                      ),in_stack_ffffffffffffff6c);
              bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_60);
              in_stack_ffffffffffffff75 = false;
              if (bVar3) {
                in_stack_ffffffffffffff75 = QFileSystemMetaData::isBundle(&pQVar6->metaData);
              }
              if ((bool)in_stack_ffffffffffffff75 != false) {
                QFlags<QAbstractFileEngine::FileFlag>::operator|=
                          ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,BundleType);
              }
            }
          }
        }
      }
    }
    local_64.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                            CONCAT15(in_stack_ffffffffffffff75,
                                                     CONCAT14(in_stack_ffffffffffffff74,
                                                              in_stack_ffffffffffffff70)))),
                    in_stack_ffffffffffffff6c);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_64);
    if (bVar3) {
      bVar3 = QFileSystemMetaData::wasDeleted((QFileSystemMetaData *)0x171eef);
      if (!bVar3) {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,ExistsFlag);
      }
      bVar3 = QFileSystemEntry::isRoot
                        ((QFileSystemEntry *)
                         CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                                 CONCAT15(in_stack_ffffffffffffff75,
                                                          CONCAT14(in_stack_ffffffffffffff74,
                                                                   in_stack_ffffffffffffff70)))));
      if (bVar3) {
        QFlags<QAbstractFileEngine::FileFlag>::operator|=
                  ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,RootFlag);
      }
      else {
        bVar3 = QFileSystemMetaData::isHidden((QFileSystemMetaData *)0x171f3b);
        if (bVar3) {
          QFlags<QAbstractFileEngine::FileFlag>::operator|=
                    ((QFlags<QAbstractFileEngine::FileFlag> *)&local_c,HiddenFlag);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)
         (QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>)local_c.i;
}

Assistant:

QAbstractFileEngine::FileFlags QFSFileEngine::fileFlags(FileFlags type) const
{
    Q_D(const QFSFileEngine);

    if (type & Refresh)
        d->metaData.clear();

    QAbstractFileEngine::FileFlags ret = { };

    if (type & FlagsMask)
        ret |= LocalDiskFlag;

    bool exists;
    {
        QFileSystemMetaData::MetaDataFlags queryFlags = { };

        queryFlags |= QFileSystemMetaData::MetaDataFlags(uint(type.toInt()))
                & QFileSystemMetaData::Permissions;

        if (type & TypesMask)
            queryFlags |= QFileSystemMetaData::AliasType
                    | QFileSystemMetaData::LinkType
                    | QFileSystemMetaData::FileType
                    | QFileSystemMetaData::DirectoryType
                    | QFileSystemMetaData::BundleType
                    | QFileSystemMetaData::WasDeletedAttribute;

        if (type & FlagsMask)
            queryFlags |= QFileSystemMetaData::HiddenAttribute
                    | QFileSystemMetaData::ExistsAttribute;
        else if (type & ExistsFlag)
            queryFlags |= QFileSystemMetaData::WasDeletedAttribute;

        queryFlags |= QFileSystemMetaData::LinkType;

        exists = d->doStat(queryFlags);
    }

    if (!exists && !d->metaData.isLink())
        return ret;

    if (exists && (type & PermsMask))
        ret |= FileFlags(uint(d->metaData.permissions().toInt()));

    if (type & TypesMask) {
        if (d->metaData.isAlias()) {
            ret |= LinkType;
        } else {
            if ((type & LinkType) && d->metaData.isLink())
                ret |= LinkType;
            if (exists) {
                if (d->metaData.isFile()) {
                    ret |= FileType;
                } else if (d->metaData.isDirectory()) {
                    ret |= DirectoryType;
                    if ((type & BundleType) && d->metaData.isBundle())
                        ret |= BundleType;
                }
            }
        }
    }

    if (type & FlagsMask) {
        // the inode existing does not mean the file exists
        if (!d->metaData.wasDeleted())
            ret |= ExistsFlag;
        if (d->fileEntry.isRoot())
            ret |= RootFlag;
        else if (d->metaData.isHidden())
            ret |= HiddenFlag;
    }

    return ret;
}